

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformedBilinear_slow_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buf1,uint *buf2,ushort *distxs,ushort *distys,int len,QTextureData *image,
               qreal *fx,qreal *fy,qreal *fw,qreal fdx,qreal fdy,qreal fdw)

{
  double dVar1;
  double dVar2;
  uchar *puVar3;
  uchar *puVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  QTextureData *in_R9;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double *in_stack_00000008;
  uchar *s2;
  uchar *s1;
  qreal py;
  qreal px;
  qreal iw;
  int i;
  Fetch1PixelFunc fetch1;
  bool useFetch;
  QPixelLayout *layout;
  int y2;
  int y1;
  int x2;
  int x1;
  double local_b0;
  int local_7c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_7c = 0; local_7c < in_R8D; local_7c = local_7c + 1) {
    if ((*(double *)s1 != 0.0) || (NAN(*(double *)s1))) {
      local_b0 = 1.0 / *(double *)s1;
    }
    else {
      local_b0 = 16384.0;
    }
    dVar1 = *in_stack_00000008;
    dVar2 = *(double *)s2;
    local_c = qFloor<double>(5.88594385948454e-317);
    local_10 = -0x55555556;
    local_14 = qFloor<double>(5.88595818738827e-317);
    local_18 = -0x55555556;
    *(short *)(in_RDX + (long)local_7c * 2) =
         (short)(int)(((dVar1 * local_b0 + -0.5) - (double)local_c) * 65536.0);
    *(short *)(in_RCX + (long)local_7c * 2) =
         (short)(int)(((dVar2 * local_b0 + -0.5) - (double)local_14) * 65536.0);
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)5>
              (in_R9->width,in_R9->x1,in_R9->x2 + -1,&local_c,&local_10);
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)5>
              (in_R9->height,in_R9->y1,in_R9->y2 + -1,&local_14,&local_18);
    puVar3 = QTextureData::scanLine(in_R9,local_14);
    puVar4 = QTextureData::scanLine(in_R9,local_18);
    *(undefined4 *)(in_RDI + (long)(local_7c << 1) * 4) =
         *(undefined4 *)(puVar3 + (long)local_c * 4);
    *(undefined4 *)(in_RDI + (long)(local_7c * 2 + 1) * 4) =
         *(undefined4 *)(puVar3 + (long)local_10 * 4);
    *(undefined4 *)(in_RSI + (long)(local_7c << 1) * 4) =
         *(undefined4 *)(puVar4 + (long)local_c * 4);
    *(undefined4 *)(in_RSI + (long)(local_7c * 2 + 1) * 4) =
         *(undefined4 *)(puVar4 + (long)local_10 * 4);
    *in_stack_00000008 = in_XMM0_Qa + *in_stack_00000008;
    *(double *)s2 = in_XMM1_Qa + *(double *)s2;
    *(double *)s1 = in_XMM2_Qa + *(double *)s1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_slow_fetcher(T *buf1, T *buf2, ushort *distxs, ushort *distys,
                                                              const int len, const QTextureData &image,
                                                              qreal &fx, qreal &fy, qreal &fw,
                                                              const qreal fdx, const qreal fdy, const qreal fdw)
{
    const QPixelLayout &layout = qPixelLayouts[image.format];
    constexpr bool useFetch = (bpp < QPixelLayout::BPP32);
    if (useFetch)
        Q_ASSERT(sizeof(T) == sizeof(uint));
    else
        Q_ASSERT(layout.bpp == bpp);

    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout.bpp] : fetch1Pixel<bpp>;

    for (int i = 0; i < len; ++i) {
        const qreal iw = fw == 0 ? 16384 : 1 / fw;
        const qreal px = fx * iw - qreal(0.5);
        const qreal py = fy * iw - qreal(0.5);

        int x1 = qFloor(px);
        int x2;
        int y1 = qFloor(py);
        int y2;

        distxs[i] = ushort((px - x1) * (1<<16));
        distys[i] = ushort((py - y1) * (1<<16));

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uchar *s1 = image.scanLine(y1);
        const uchar *s2 = image.scanLine(y2);
        if constexpr (useFetch) {
            buf1[i * 2 + 0] = fetch1(s1, x1);
            buf1[i * 2 + 1] = fetch1(s1, x2);
            buf2[i * 2 + 0] = fetch1(s2, x1);
            buf2[i * 2 + 1] = fetch1(s2, x2);
        } else {
            buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
            buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
            buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
            buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
        }

        fx += fdx;
        fy += fdy;
        fw += fdw;
    }
}